

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

_Bool consume(ch_compilation *comp,ch_token_kind kind,char *error_message,ch_token *out_token)

{
  _Bool _Var1;
  
  _Var1 = opt_consume(comp,kind,out_token);
  if (!_Var1) {
    error(comp,error_message);
  }
  return _Var1;
}

Assistant:

bool consume(ch_compilation *comp, ch_token_kind kind,
             const char *error_message, ch_token *out_token) {
    bool result = opt_consume(comp, kind, out_token);
    if (!result) {
      error(comp, error_message);
    }

    return result;
}